

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkStatement
          (cmNinjaNormalTargetGenerator *this,string *config,string *fileConfig,string *outputDir,
          string *output)

{
  cmNinjaVars *this_00;
  cmGeneratorTarget *this_01;
  cmLocalNinjaGenerator *pcVar1;
  cmLocalNinjaGenerator *this_02;
  cmMakefile *this_03;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  TargetType TVar6;
  int iVar7;
  string *psVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  size_t sVar11;
  cmGeneratedFileStream *os;
  string_view source;
  string_view source_00;
  string_view source_01;
  string_view source_02;
  string_view source_03;
  allocator<char> local_3d9;
  cmGeneratorTarget *local_3d8;
  cmGlobalNinjaGenerator *local_3d0;
  bool usedResponseFile;
  allocator<char> local_3a1;
  string objPath;
  key_type local_380;
  string langFlags;
  string frameworkPath;
  cmNinjaLinkLineDeviceComputer linkLineComputer;
  Names tgtNames;
  string targetOutputImplib;
  string linkPath;
  string createRule;
  cmNinjaBuild build;
  string local_50;
  
  this_01 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  local_3d0 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  local_3d8 = this_01;
  cmGeneratorTarget::GetFullPath(&build.Comment,this_01,config,ImportLibraryArtifact,false);
  psVar8 = cmNinjaTargetGenerator::ConvertToNinjaPath
                     (&this->super_cmNinjaTargetGenerator,&build.Comment);
  std::__cxx11::string::string((string *)&targetOutputImplib,(string *)psVar8);
  std::__cxx11::string::~string((string *)&build);
  bVar3 = std::operator!=(config,fileConfig);
  if (bVar3) {
    pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    (*(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
      _vptr_cmOutputConverter[0x10])(&tgtNames,pcVar1,local_3d8);
    (*(local_3d0->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
      [0x4d])(&linkLineComputer,local_3d0,fileConfig);
    cmStrCat<std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
              (&build.Comment,&tgtNames.Base,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &linkLineComputer,(char (*) [2])0x8477b1);
    std::__cxx11::string::~string((string *)&linkLineComputer);
    std::__cxx11::string::~string((string *)&tgtNames);
    (*(local_3d0->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
      [0x18])(&tgtNames,local_3d0,outputDir,fileConfig);
    std::__cxx11::string::operator=((string *)&build,(string *)&tgtNames);
    std::__cxx11::string::~string((string *)&tgtNames);
    _Var4 = std::operator==(outputDir,&build.Comment);
    if (_Var4) {
      std::__cxx11::string::~string((string *)&build);
      goto LAB_00438059;
    }
    cmGeneratorTarget::GetFullName(&tgtNames.Base,local_3d8,config,ImportLibraryArtifact);
    if (tgtNames.Base._M_string_length != 0) {
      cmGeneratorTarget::GetFullName
                ((string *)&linkLineComputer,local_3d8,fileConfig,ImportLibraryArtifact);
      if (linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
          DirectoryState.Tree != (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0)
      {
        cmGeneratorTarget::GetFullPath
                  (&frameworkPath,local_3d8,fileConfig,ImportLibraryArtifact,false);
        psVar8 = cmNinjaTargetGenerator::ConvertToNinjaPath
                           (&this->super_cmNinjaTargetGenerator,&frameworkPath);
        _Var4 = std::operator==(&targetOutputImplib,psVar8);
        std::__cxx11::string::~string((string *)&frameworkPath);
        std::__cxx11::string::~string((string *)&linkLineComputer);
        std::__cxx11::string::~string((string *)&tgtNames);
        std::__cxx11::string::~string((string *)&build);
        if (_Var4) goto LAB_00438059;
        goto LAB_00437661;
      }
      std::__cxx11::string::~string((string *)&linkLineComputer);
    }
    std::__cxx11::string::~string((string *)&tgtNames);
    std::__cxx11::string::~string((string *)&build);
  }
LAB_00437661:
  LanguageLinkerDeviceRule(&local_50,this,config);
  cmNinjaBuild::cmNinjaBuild(&build,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer._vptr_cmLinkLineComputer
       = (_func_int **)GetVisibleTypeName(this);
  frameworkPath._M_dataplus._M_p._0_1_ = 0x20;
  cmStrCat<char_const(&)[10],char_const*,char,std::__cxx11::string_const&>
            (&tgtNames.Base,(char (*) [10])"Link the ",(char **)&linkLineComputer,
             (char *)&frameworkPath,output);
  std::__cxx11::string::operator=((string *)&build,(string *)&tgtNames);
  std::__cxx11::string::~string((string *)&tgtNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&build.Outputs,output);
  cmNinjaTargetGenerator::GetObjects
            ((cmNinjaDeps *)&tgtNames,&this->super_cmNinjaTargetGenerator,config);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&build.ExplicitDeps,&tgtNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tgtNames);
  TargetLinkLanguage(&tgtNames.Base,this,config);
  cmNinjaTargetGenerator::ComputeLinkDeps
            ((cmNinjaDeps *)&linkLineComputer,&this->super_cmNinjaTargetGenerator,&tgtNames.Base,
             config,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&build.ImplicitDeps,&linkLineComputer);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&linkLineComputer);
  std::__cxx11::string::~string((string *)&tgtNames);
  frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
  frameworkPath._M_string_length = 0;
  frameworkPath.field_2._M_local_buf[0] = '\0';
  linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
  linkPath._M_string_length = 0;
  linkPath.field_2._M_local_buf[0] = '\0';
  TargetLinkLanguage(&tgtNames.Base,this,config);
  cmGeneratorTarget::GetCreateRuleVariable(&createRule,local_3d8,&tgtNames.Base,config);
  std::__cxx11::string::~string((string *)&tgtNames);
  pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  source._M_str = (output->_M_dataplus)._M_p;
  source._M_len = output->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&tgtNames.Base,(cmOutputConverter *)pcVar1,source,SHELL,false);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linkLineComputer,"TARGET_FILE",(allocator<char> *)&langFlags);
  this_00 = &build.Variables;
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,(key_type *)&linkLineComputer);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&tgtNames);
  std::__cxx11::string::~string((string *)&linkLineComputer);
  std::__cxx11::string::~string((string *)&tgtNames);
  this_02 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&langFlags,(cmLocalGenerator *)this_02);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&tgtNames,(cmStateSnapshot *)&langFlags);
  cmNinjaLinkLineDeviceComputer::cmNinjaLinkLineDeviceComputer
            (&linkLineComputer,(cmOutputConverter *)this_02,(cmStateDirectory *)&tgtNames,local_3d0)
  ;
  iVar5 = (*(local_3d0->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
            _vptr_cmGlobalGenerator[0x28])();
  cmLinkLineComputer::SetUseNinjaMulti((cmLinkLineComputer *)&linkLineComputer,SUB41(iVar5,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tgtNames,"LINK_LIBRARIES",(allocator<char> *)&objPath);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&tgtNames.Base);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&langFlags,"LINK_FLAGS",(allocator<char> *)&usedResponseFile);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_00,&langFlags);
  cmLocalGenerator::GetDeviceLinkFlags
            ((cmLocalGenerator *)pcVar1,&linkLineComputer.super_cmLinkLineDeviceComputer,config,
             pmVar9,pmVar10,&frameworkPath,&linkPath,local_3d8);
  std::__cxx11::string::~string((string *)&langFlags);
  std::__cxx11::string::~string((string *)&tgtNames);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tgtNames,"JOB_POOL_LINK",(allocator<char> *)&langFlags);
  cmNinjaTargetGenerator::addPoolNinjaVariable
            (&this->super_cmNinjaTargetGenerator,&tgtNames.Base,local_3d8,this_00);
  std::__cxx11::string::~string((string *)&tgtNames);
  cmCommonTargetGenerator::GetManifests(&tgtNames.Base,(cmCommonTargetGenerator *)this,config);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&langFlags,"MANIFESTS",(allocator<char> *)&objPath);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&langFlags);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&tgtNames);
  std::__cxx11::string::~string((string *)&langFlags);
  std::__cxx11::string::~string((string *)&tgtNames);
  std::operator+(&tgtNames.Base,&frameworkPath,&linkPath);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&langFlags,"LINK_PATH",(allocator<char> *)&objPath);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&langFlags);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&tgtNames);
  std::__cxx11::string::~string((string *)&langFlags);
  std::__cxx11::string::~string((string *)&tgtNames);
  langFlags._M_dataplus._M_p = (pointer)&langFlags.field_2;
  langFlags._M_string_length = 0;
  langFlags.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tgtNames,"CUDA",(allocator<char> *)&objPath);
  cmLocalGenerator::AddLanguageFlagsForLinking
            ((cmLocalGenerator *)pcVar1,&langFlags,local_3d8,&tgtNames.Base,config);
  std::__cxx11::string::~string((string *)&tgtNames);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tgtNames,"LANGUAGE_COMPILE_FLAGS",(allocator<char> *)&objPath);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&tgtNames.Base);
  std::__cxx11::string::_M_assign((string *)pmVar9);
  std::__cxx11::string::~string((string *)&tgtNames);
  TargetNames(&tgtNames,this,config);
  bVar3 = cmGeneratorTarget::HasSOName(local_3d8,config);
  if (bVar3) {
    this_03 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    TargetLinkLanguage(&objPath,this,config);
    cmMakefile::GetSONameFlag(this_03,&objPath);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&usedResponseFile,"SONAME_FLAG",(allocator<char> *)&local_380);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,(key_type *)&usedResponseFile);
    std::__cxx11::string::assign((char *)pmVar9);
    std::__cxx11::string::~string((string *)&usedResponseFile);
    std::__cxx11::string::~string((string *)&objPath);
    source_00._M_str = tgtNames.SharedObject._M_dataplus._M_p;
    source_00._M_len = tgtNames.SharedObject._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&objPath,(cmOutputConverter *)pcVar1,source_00,SHELL,false);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&usedResponseFile,"SONAME",(allocator<char> *)&local_380);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,(key_type *)&usedResponseFile);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&objPath);
    std::__cxx11::string::~string((string *)&usedResponseFile);
    std::__cxx11::string::~string((string *)&objPath);
    TVar6 = cmGeneratorTarget::GetType(local_3d8);
    if (TVar6 == SHARED_LIBRARY) {
      cmGeneratorTarget::GetInstallNameDirForBuildTree
                (&objPath,(this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget,config);
      if (objPath._M_string_length != 0) {
        source_01._M_str = objPath._M_dataplus._M_p;
        source_01._M_len = objPath._M_string_length;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  ((string *)&usedResponseFile,(cmOutputConverter *)pcVar1,source_01,SHELL,false);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_380,"INSTALLNAME_DIR",&local_3d9);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](this_00,&local_380);
        std::__cxx11::string::operator=((string *)pmVar9,(string *)&usedResponseFile);
        std::__cxx11::string::~string((string *)&local_380);
        std::__cxx11::string::~string((string *)&usedResponseFile);
      }
      std::__cxx11::string::~string((string *)&objPath);
    }
  }
  if (tgtNames.ImportLibrary._M_string_length != 0) {
    source_02._M_str = targetOutputImplib._M_dataplus._M_p;
    source_02._M_len = targetOutputImplib._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&objPath,(cmOutputConverter *)pcVar1,source_02,SHELL,false);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&usedResponseFile,"TARGET_IMPLIB",(allocator<char> *)&local_380);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,(key_type *)&usedResponseFile);
    std::__cxx11::string::_M_assign((string *)pmVar9);
    std::__cxx11::string::~string((string *)&usedResponseFile);
    cmNinjaTargetGenerator::EnsureParentDirectoryExists
              (&this->super_cmNinjaTargetGenerator,&targetOutputImplib);
    std::__cxx11::string::~string((string *)&objPath);
  }
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            ((string *)&usedResponseFile,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  (*(local_3d0->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4d]
  )(&local_380,local_3d0,config);
  cmStrCat<std::__cxx11::string,std::__cxx11::string>
            (&objPath,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &usedResponseFile,&local_380);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&usedResponseFile);
  pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  psVar8 = cmNinjaTargetGenerator::ConvertToNinjaPath(&this->super_cmNinjaTargetGenerator,&objPath);
  source_03._M_str = (psVar8->_M_dataplus)._M_p;
  source_03._M_len = psVar8->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            ((string *)&usedResponseFile,(cmOutputConverter *)pcVar1,source_03,SHELL,false);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"OBJECT_DIR",&local_3d9);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_380);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&usedResponseFile);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&usedResponseFile);
  cmNinjaTargetGenerator::EnsureDirectoryExists(&this->super_cmNinjaTargetGenerator,&objPath);
  cmNinjaTargetGenerator::SetMsvcTargetPdbVariable
            (&this->super_cmNinjaTargetGenerator,this_00,config);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&usedResponseFile,"LINK_LIBRARIES",(allocator<char> *)&local_380);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,(key_type *)&usedResponseFile);
  std::__cxx11::string::~string((string *)&usedResponseFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&usedResponseFile,"LINK_PATH",(allocator<char> *)&local_380);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_00,(key_type *)&usedResponseFile);
  std::__cxx11::string::~string((string *)&usedResponseFile);
  if (local_3d0->UsingGCCOnWindows == true) {
    _Var2._M_current = (pmVar9->_M_dataplus)._M_p;
    usedResponseFile = true;
    local_380._M_dataplus._M_p._0_1_ = 0x2f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (_Var2,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(_Var2._M_current + pmVar9->_M_string_length),&usedResponseFile,
               (char *)&local_380);
    _Var2._M_current = (pmVar10->_M_dataplus)._M_p;
    usedResponseFile = true;
    local_380._M_dataplus._M_p._0_1_ = 0x2f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (_Var2,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(_Var2._M_current + pmVar10->_M_string_length),&usedResponseFile,
               (char *)&local_380);
  }
  sVar11 = cmSystemTools::CalculateCommandLineLengthLimit();
  iVar5 = cmGlobalNinjaGenerator::GetRuleCmdLength(local_3d0,&build.Rule);
  psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(local_3d8);
  iVar7 = (*(local_3d0->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
            _vptr_cmGlobalGenerator[0x28])();
  if ((char)iVar7 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"",&local_3a1);
  }
  else {
    local_3d9 = (allocator<char>)0x2e;
    cmStrCat<char,std::__cxx11::string_const&>(&local_380,(char *)&local_3d9,config);
  }
  cmStrCat<char_const(&)[12],std::__cxx11::string_const&,std::__cxx11::string,char_const(&)[5]>
            ((string *)&usedResponseFile,(char (*) [12])0x7d2d9c,psVar8,&local_380,
             (char (*) [5])0x7e366e);
  cmNinjaTargetGenerator::ConvertToNinjaPath
            (&this->super_cmNinjaTargetGenerator,(string *)&usedResponseFile);
  std::__cxx11::string::_M_assign((string *)&build.RspFile);
  std::__cxx11::string::~string((string *)&usedResponseFile);
  std::__cxx11::string::~string((string *)&local_380);
  cmLocalNinjaGenerator::AppendTargetDepends
            ((this->super_cmNinjaTargetGenerator).LocalGenerator,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &build.OrderOnlyDeps,config,config,DependOnTargetArtifact);
  usedResponseFile = false;
  os = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteBuild
            (local_3d0,(ostream *)os,&build,(int)sVar11 - iVar5,&usedResponseFile);
  WriteNvidiaDeviceLinkRule(this,usedResponseFile,config);
  std::__cxx11::string::~string((string *)&objPath);
  cmGeneratorTarget::Names::~Names(&tgtNames);
  std::__cxx11::string::~string((string *)&langFlags);
  cmLinkLineDeviceComputer::~cmLinkLineDeviceComputer
            (&linkLineComputer.super_cmLinkLineDeviceComputer);
  std::__cxx11::string::~string((string *)&createRule);
  std::__cxx11::string::~string((string *)&linkPath);
  std::__cxx11::string::~string((string *)&frameworkPath);
  cmNinjaBuild::~cmNinjaBuild(&build);
LAB_00438059:
  std::__cxx11::string::~string((string *)&targetOutputImplib);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkStatement(
  const std::string& config, const std::string& fileConfig,
  const std::string& outputDir, const std::string& output)
{
  cmGeneratorTarget* genTarget = this->GetGeneratorTarget();
  cmGlobalNinjaGenerator* globalGen = this->GetGlobalGenerator();

  std::string targetOutputImplib = this->ConvertToNinjaPath(
    genTarget->GetFullPath(config, cmStateEnums::ImportLibraryArtifact));

  if (config != fileConfig) {
    std::string targetOutputFileConfigDir =
      cmStrCat(this->GetLocalGenerator()->GetTargetDirectory(genTarget),
               globalGen->ConfigDirectory(fileConfig), "/");
    targetOutputFileConfigDir =
      globalGen->ExpandCFGIntDir(outputDir, fileConfig);
    if (outputDir == targetOutputFileConfigDir) {
      return;
    }

    if (!genTarget->GetFullName(config, cmStateEnums::ImportLibraryArtifact)
           .empty() &&
        !genTarget
           ->GetFullName(fileConfig, cmStateEnums::ImportLibraryArtifact)
           .empty() &&
        targetOutputImplib ==
          this->ConvertToNinjaPath(genTarget->GetFullPath(
            fileConfig, cmStateEnums::ImportLibraryArtifact))) {
      return;
    }
  }

  // Compute the comment.
  cmNinjaBuild build(this->LanguageLinkerDeviceRule(config));
  build.Comment =
    cmStrCat("Link the ", this->GetVisibleTypeName(), ' ', output);

  cmNinjaVars& vars = build.Variables;

  // Compute outputs.
  build.Outputs.push_back(output);
  // Compute specific libraries to link with.
  build.ExplicitDeps = this->GetObjects(config);
  build.ImplicitDeps =
    this->ComputeLinkDeps(this->TargetLinkLanguage(config), config);

  std::string frameworkPath;
  std::string linkPath;

  std::string createRule =
    genTarget->GetCreateRuleVariable(this->TargetLinkLanguage(config), config);
  cmLocalNinjaGenerator& localGen = *this->GetLocalGenerator();

  vars["TARGET_FILE"] =
    localGen.ConvertToOutputFormat(output, cmOutputConverter::SHELL);

  cmNinjaLinkLineDeviceComputer linkLineComputer(
    this->GetLocalGenerator(),
    this->GetLocalGenerator()->GetStateSnapshot().GetDirectory(), globalGen);
  linkLineComputer.SetUseNinjaMulti(globalGen->IsMultiConfig());

  localGen.GetDeviceLinkFlags(linkLineComputer, config, vars["LINK_LIBRARIES"],
                              vars["LINK_FLAGS"], frameworkPath, linkPath,
                              genTarget);

  this->addPoolNinjaVariable("JOB_POOL_LINK", genTarget, vars);

  vars["MANIFESTS"] = this->GetManifests(config);

  vars["LINK_PATH"] = frameworkPath + linkPath;

  // Compute language specific link flags.
  std::string langFlags;
  localGen.AddLanguageFlagsForLinking(langFlags, genTarget, "CUDA", config);
  vars["LANGUAGE_COMPILE_FLAGS"] = langFlags;

  auto const tgtNames = this->TargetNames(config);
  if (genTarget->HasSOName(config)) {
    vars["SONAME_FLAG"] =
      this->GetMakefile()->GetSONameFlag(this->TargetLinkLanguage(config));
    vars["SONAME"] = localGen.ConvertToOutputFormat(tgtNames.SharedObject,
                                                    cmOutputConverter::SHELL);
    if (genTarget->GetType() == cmStateEnums::SHARED_LIBRARY) {
      std::string install_dir =
        this->GetGeneratorTarget()->GetInstallNameDirForBuildTree(config);
      if (!install_dir.empty()) {
        vars["INSTALLNAME_DIR"] = localGen.ConvertToOutputFormat(
          install_dir, cmOutputConverter::SHELL);
      }
    }
  }

  if (!tgtNames.ImportLibrary.empty()) {
    const std::string impLibPath = localGen.ConvertToOutputFormat(
      targetOutputImplib, cmOutputConverter::SHELL);
    vars["TARGET_IMPLIB"] = impLibPath;
    this->EnsureParentDirectoryExists(targetOutputImplib);
  }

  const std::string objPath =
    cmStrCat(this->GetGeneratorTarget()->GetSupportDirectory(),
             globalGen->ConfigDirectory(config));

  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    this->ConvertToNinjaPath(objPath), cmOutputConverter::SHELL);
  this->EnsureDirectoryExists(objPath);

  this->SetMsvcTargetPdbVariable(vars, config);

  std::string& linkLibraries = vars["LINK_LIBRARIES"];
  std::string& link_path = vars["LINK_PATH"];
  if (globalGen->IsGCCOnWindows()) {
    // ar.exe can't handle backslashes in rsp files (implicitly used by gcc)
    std::replace(linkLibraries.begin(), linkLibraries.end(), '\\', '/');
    std::replace(link_path.begin(), link_path.end(), '\\', '/');
  }

  // Device linking currently doesn't support response files so
  // do not check if the user has explicitly forced a response file.
  int const commandLineLengthLimit =
    static_cast<int>(cmSystemTools::CalculateCommandLineLengthLimit()) -
    globalGen->GetRuleCmdLength(build.Rule);

  build.RspFile = this->ConvertToNinjaPath(
    cmStrCat("CMakeFiles/", genTarget->GetName(),
             globalGen->IsMultiConfig() ? cmStrCat('.', config) : "", ".rsp"));

  // Gather order-only dependencies.
  this->GetLocalGenerator()->AppendTargetDepends(
    this->GetGeneratorTarget(), build.OrderOnlyDeps, config, config,
    DependOnTargetArtifact);

  // Write the build statement for this target.
  bool usedResponseFile = false;
  globalGen->WriteBuild(this->GetCommonFileStream(), build,
                        commandLineLengthLimit, &usedResponseFile);
  this->WriteNvidiaDeviceLinkRule(usedResponseFile, config);
}